

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

bool __thiscall AmpIO::ReadMotorConfig(AmpIO *this,uint index,uint32_t *cfg)

{
  BasePort *pBVar1;
  uint32_t uVar2;
  int iVar3;
  bool local_29;
  uint channel;
  bool ret;
  uint32_t *cfg_local;
  uint index_local;
  AmpIO *this_local;
  
  local_29 = false;
  uVar2 = BoardIO::GetFirmwareVersion((BoardIO *)this);
  if (uVar2 < 8) {
    this_local._7_1_ = false;
  }
  else {
    uVar2 = BoardIO::GetHardwareVersion((BoardIO *)this);
    if (uVar2 == 0x64524131) {
      *cfg = 0x3000000;
      local_29 = true;
    }
    else if (((this->super_FpgaIO).super_BoardIO.port != (BasePort *)0x0) &&
            (index < this->NumMotors)) {
      pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
      iVar3 = (*pBVar1->_vptr_BasePort[0x23])
                        (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,
                         (ulong)((index + 1) * 0x10 | 0xb),cfg);
      local_29 = (bool)((byte)iVar3 & 1);
    }
    this_local._7_1_ = local_29;
  }
  return this_local._7_1_;
}

Assistant:

bool AmpIO::ReadMotorConfig(unsigned int index, uint32_t &cfg) const
{
    bool ret = false;
    if (GetFirmwareVersion() < 8) return ret;

    if (GetHardwareVersion() == dRA1_String) {
        // dRAC supports either voltage or current control
        cfg = MCFG_VOLTAGE_CONTROL | MCFG_CURRENT_CONTROL;
        ret = true;
    }
    else if (port && (index < NumMotors)) {
        unsigned int channel = (index+1) << 4;
        ret = port->ReadQuadlet(BoardId, channel | MOTOR_CONFIG_REG, cfg);
    }
    return ret;
}